

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

int yang_read_common(lys_module *module,char *value,yytokentype type)

{
  char *pcVar1;
  LY_ERR *pLVar2;
  int local_20;
  int ret;
  yytokentype type_local;
  char *value_local;
  lys_module *module_local;
  
  local_20 = 0;
  switch(type) {
  case CONTACT_KEYWORD:
    local_20 = yang_check_string(module,&module->contact,"contact","module",value,(lys_node *)0x0);
    break;
  default:
    free(value);
    pLVar2 = ly_errno_location();
    *pLVar2 = LY_EINT;
    ly_log(LY_LLERR,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/parser_yang.c"
           ,0x43);
    local_20 = 1;
    break;
  case MODULE_KEYWORD:
    pcVar1 = lydict_insert_zc(module->ctx,value);
    module->name = pcVar1;
    break;
  case NAMESPACE_KEYWORD:
    local_20 = yang_check_string(module,&module->ns,"namespace","module",value,(lys_node *)0x0);
    break;
  case ORGANIZATION_KEYWORD:
    local_20 = yang_check_string(module,&module->org,"organization","module",value,(lys_node *)0x0);
  }
  return local_20;
}

Assistant:

int
yang_read_common(struct lys_module *module, char *value, enum yytokentype type)
{
    int ret = 0;

    switch (type) {
    case MODULE_KEYWORD:
        module->name = lydict_insert_zc(module->ctx, value);
        break;
    case NAMESPACE_KEYWORD:
        ret = yang_check_string(module, &module->ns, "namespace", "module", value, NULL);
        break;
    case ORGANIZATION_KEYWORD:
        ret = yang_check_string(module, &module->org, "organization", "module", value, NULL);
        break;
    case CONTACT_KEYWORD:
        ret = yang_check_string(module, &module->contact, "contact", "module", value, NULL);
        break;
    default:
        free(value);
        LOGINT;
        ret = EXIT_FAILURE;
        break;
    }

    return ret;
}